

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  char *__s2;
  byte bVar2;
  time_t tVar3;
  uchar uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  GREATEST_INIT();
  uVar4 = greatest_info.verbosity;
  bVar2 = greatest_info.flags;
  for (iVar5 = 1; iVar5 < argc; iVar5 = iVar5 + 1) {
    __s2 = argv[iVar5];
    if (*__s2 == '-') {
      bVar1 = __s2[1];
      switch(bVar1) {
      case 0x65:
        greatest_info.exact_name_match = '\x01';
        break;
      case 0x66:
        bVar2 = bVar2 | 1;
        greatest_info.flags = bVar2;
        break;
      case 0x67:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6d:
      case 0x6e:
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x75:
      case 0x77:
switchD_001033a1_caseD_67:
        iVar5 = strncmp("--help",__s2,6);
        if (iVar5 == 0) {
switchD_001033a1_caseD_68:
          greatest_usage(*argv);
          exit(0);
        }
        uVar7 = bVar1 - 0x2d;
        if (uVar7 == 0) {
          uVar7 = (uint)(byte)__s2[2];
        }
        if (uVar7 != 0) {
          fprintf(_stdout,"Unknown argument \'%s\'\n",__s2);
LAB_001034dd:
          greatest_usage(*argv);
          exit(1);
        }
        goto LAB_0010344b;
      case 0x68:
        goto switchD_001033a1_caseD_68;
      case 0x6c:
        bVar2 = bVar2 | 2;
        greatest_info.flags = bVar2;
        break;
      case 0x73:
      case 0x74:
      case 0x78:
        iVar6 = iVar5 + 1;
        if (argc <= iVar6) goto LAB_001034dd;
        if (5 < bVar1 - 0x73) goto switchD_001033a1_caseD_67;
        switch((uint)bVar1) {
        case 0x73:
          greatest_info.suite_filter = argv[iVar6];
          iVar5 = iVar6;
          break;
        case 0x74:
          greatest_info.test_filter = argv[iVar6];
          iVar5 = iVar6;
          break;
        default:
          goto switchD_001033a1_caseD_67;
        case 0x76:
          goto switchD_001033a1_caseD_76;
        case 0x78:
          greatest_info.test_exclude = argv[iVar6];
          iVar5 = iVar6;
        }
        break;
      case 0x76:
switchD_001033a1_caseD_76:
        uVar4 = uVar4 + '\x01';
        greatest_info.verbosity = uVar4;
        break;
      default:
        if (bVar1 != 0x61) goto switchD_001033a1_caseD_67;
        bVar2 = bVar2 | 4;
        greatest_info.flags = bVar2;
      }
    }
  }
LAB_0010344b:
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  tinf_init();
  greatest_run_suite(tinflate,"tinflate");
  greatest_run_suite(tinfzlib,"tinfzlib");
  greatest_run_suite(tinfgzip,"tinfgzip");
  GREATEST_PRINT_REPORT();
  return (int)(greatest_info.failed != 0);
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}